

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

void __thiscall
FIX::ScreenLogFactory::ScreenLogFactory(ScreenLogFactory *this,SessionSettings *settings)

{
  *(undefined **)this = &Message::typeinfo;
  *(undefined4 *)(this + 8) = 0x1000000;
  SessionSettings::SessionSettings((SessionSettings *)(this + 0x10),settings);
  return;
}

Assistant:

ScreenLogFactory(bool incoming, bool outgoing, bool event)
      : m_incoming(incoming),
        m_outgoing(outgoing),
        m_event(event),
        m_useSettings(false) {}